

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

int __thiscall
CVmObjFileName::getp_listDir(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t file_type;
  undefined8 *puVar2;
  long *plVar3;
  vm_filnam_ext *this_00;
  DIR *__dirp;
  dirent *pdVar4;
  int *in_RCX;
  vm_rcdesc *in_RDI;
  err_frame_t err_cur__;
  CVmNetFile *netfile;
  vm_rcdesc rc;
  uint argc;
  vm_val_t *in_stack_fffffffffffffe68;
  void *pvVar5;
  CVmNetFile *in_stack_fffffffffffffe70;
  undefined8 uVar6;
  vm_val_t *in_stack_fffffffffffffe78;
  CVmNetFile *this_01;
  undefined4 in_stack_fffffffffffffe80;
  int access;
  uint local_170;
  vm_obj_id_t in_stack_fffffffffffffe94;
  void *local_160;
  __jmp_buf_tag _Stack_158;
  CVmNetFile *local_90;
  int local_2c;
  
  if (in_RCX == (int *)0x0) {
    access = 0;
  }
  else {
    access = *in_RCX;
  }
  local_2c = access;
  if ((getp_listDir(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_listDir(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_listDir::desc,0);
    __cxa_guard_release(&getp_listDir(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_fffffffffffffe78,(uint *)in_stack_fffffffffffffe70,
                     (CVmNativeCodeDesc *)in_stack_fffffffffffffe68);
  if (iVar1 == 0) {
    file_type = CVmMetaclass::get_class_obj
                          ((CVmMetaclass *)CONCAT44(access,in_stack_fffffffffffffe80));
    CVmStack::get(0);
    vm_rcdesc::vm_rcdesc
              ((vm_rcdesc *)CONCAT44(access,file_type),(char *)in_stack_fffffffffffffe78,
               (vm_obj_id_t)((ulong)in_stack_fffffffffffffe70 >> 0x20),
               (unsigned_short)((ulong)in_stack_fffffffffffffe70 >> 0x10),in_stack_fffffffffffffe68,
               0);
    local_90 = CVmObjFile::get_filename_from_obj
                         (in_stack_fffffffffffffe94,in_RDI,access,file_type,
                          (char *)in_stack_fffffffffffffe78);
    puVar2 = (undefined8 *)_ZTW11G_err_frame();
    uVar6 = *puVar2;
    plVar3 = (long *)_ZTW11G_err_frame();
    *plVar3 = (long)&local_170;
    local_170 = _setjmp(&_Stack_158);
    if (local_170 == 0) {
      this_01 = local_90;
      this_00 = get_ext((CVmObjFileName *)in_RDI);
      __dirp = (DIR *)vm_filnam_ext::get_str(this_00);
      pdVar4 = CVmNetFile::readdir(this_01,__dirp);
      if ((int)pdVar4 == 0) {
        CVmRun::throw_new_class
                  ((CVmRun *)CONCAT44(access,file_type),(vm_obj_id_t)((ulong)this_01 >> 0x20),
                   (uint)this_01,(char *)in_stack_fffffffffffffe70);
      }
    }
    if ((local_170 & 0x8000) == 0) {
      local_170 = local_170 | 0x8000;
      CVmNetFile::abandon(in_stack_fffffffffffffe70);
    }
    puVar2 = (undefined8 *)_ZTW11G_err_frame();
    *puVar2 = uVar6;
    if ((local_170 & 0x4001) != 0) {
      puVar2 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar2 & 2) != 0) {
        plVar3 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar3 + 0x10));
      }
      pvVar5 = local_160;
      plVar3 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar3 + 0x10) = pvVar5;
      err_rethrow();
    }
    if ((local_170 & 2) != 0) {
      free(local_160);
    }
    CVmStack::discard(local_2c);
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_listDir(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename; use the READ DIR access mode */
    vm_rcdesc rc(vmg_ "FileName.listDir",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_LISTDIR, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmObjFile::get_filename_from_obj(
        vmg_ self, &rc, VMOBJFILE_ACCESS_READDIR,
        OSFTUNK, "application/octet-stream");
    
    err_try
    {
        /* get the directory listing */
        if (!netfile->readdir(vmg_ get_ext()->get_str(), retval))
            G_interpreter->throw_new_class(vmg_ G_predef->file_open_exc,
                                           0, "error reading directory");
    }